

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void tinygltf::SerializeGltfTextureInfo(TextureInfo *texinfo,json *o)

{
  char cVar1;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  json *local_18;
  json *o_local;
  TextureInfo *texinfo_local;
  
  local_18 = o;
  o_local = (json *)texinfo;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"index",&local_39);
  SerializeNumberProperty<int>(&local_38,*(int *)o_local,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (*(int *)&o_local->field_0x4 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"texCoord",&local_71);
    SerializeNumberProperty<int>(&local_70,*(int *)&o_local->field_0x4,local_18);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  cVar1 = Value::Type((Value *)&o_local->m_value);
  if (cVar1 != '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"extras",&local_99);
    SerializeValue(&local_98,(Value *)&o_local->m_value,local_18);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  SerializeExtensionMap((ExtensionMap *)(o_local + 10),local_18);
  return;
}

Assistant:

static void SerializeGltfTextureInfo(TextureInfo &texinfo, json &o) {
  SerializeNumberProperty("index", texinfo.index, o);

  if (texinfo.texCoord != 0) {
    SerializeNumberProperty("texCoord", texinfo.texCoord, o);
  }

  if (texinfo.extras.Type() != NULL_TYPE) {
    SerializeValue("extras", texinfo.extras, o);
  }

  SerializeExtensionMap(texinfo.extensions, o);
}